

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tests.c
# Opt level: O1

void test_fixed_wnaf_small_helper(int *wnaf,int *wnaf_expected,int w)

{
  undefined1 *puVar1;
  byte bVar2;
  byte bVar3;
  uint uVar4;
  int iVar5;
  ulong uVar6;
  secp256k1_scratch *scratch;
  ulong extraout_RAX;
  code *pcVar7;
  long lVar8;
  secp256k1_strauss_point_state *psVar9;
  long extraout_RDX;
  ulong uVar10;
  secp256k1_strauss_point_state *scratch_00;
  size_t sVar11;
  secp256k1_gej *r;
  secp256k1_gej *psVar12;
  secp256k1_strauss_point_state *psVar13;
  byte *out32;
  secp256k1_gej *psVar14;
  secp256k1_strauss_point_state *scratch_01;
  secp256k1_gej *psVar15;
  secp256k1_sha256 *hash;
  secp256k1_strauss_point_state *elem;
  code *cb;
  secp256k1_strauss_point_state *cbdata;
  uint64_t *unaff_R12;
  secp256k1_sha256 *hash_00;
  secp256k1_callback *error_callback;
  secp256k1_ge *unaff_R13;
  secp256k1_scalar *psVar16;
  secp256k1_sha256 *acc;
  secp256k1_strauss_point_state *r_00;
  bool bVar17;
  ulong uStack_2098;
  secp256k1_strauss_state sStack_2080;
  secp256k1_fe asStack_2068 [8];
  secp256k1_strauss_point_state sStack_1f28;
  secp256k1_ge asStack_1b18 [8];
  secp256k1_callback *psStack_1848;
  secp256k1_gej *psStack_1840;
  secp256k1_strauss_point_state *psStack_1838;
  secp256k1_strauss_point_state *psStack_1830;
  secp256k1_strauss_point_state *psStack_1828;
  secp256k1_strauss_point_state *psStack_1818;
  undefined1 auStack_1800 [8];
  undefined1 auStack_17f8 [88];
  secp256k1_gej sStack_17a0;
  secp256k1_gej sStack_1720;
  secp256k1_gej sStack_16a0;
  secp256k1_gej sStack_1620;
  secp256k1_gej asStack_15a0 [2];
  secp256k1_strauss_point_state sStack_1460;
  secp256k1_gej sStack_1050;
  secp256k1_gej sStack_fd0;
  undefined1 auStack_f50 [720];
  secp256k1_sha256 *psStack_c80;
  secp256k1_scratch *psStack_c78;
  secp256k1_sha256 *psStack_c70;
  secp256k1_gej *psStack_c68;
  code *pcStack_c60;
  int iStack_c56;
  undefined2 uStack_c52;
  long lStack_c50;
  byte abStack_c48 [32];
  undefined1 auStack_c28 [40];
  uchar auStack_c00 [88];
  int aiStack_ba8 [4];
  secp256k1_sha256 sStack_b98;
  secp256k1_gej *psStack_b30;
  uint64_t *puStack_b28;
  secp256k1_ge *psStack_b20;
  secp256k1_context *psStack_b18;
  secp256k1_gej *psStack_b10;
  secp256k1_strauss_point_state *psStack_b08;
  undefined1 auStack_b00 [64];
  secp256k1_gej sStack_ac0;
  secp256k1_strauss_state sStack_a40;
  secp256k1_gej sStack_a28;
  secp256k1_gej sStack_9a8;
  secp256k1_gej sStack_928;
  secp256k1_context sStack_8a8;
  secp256k1_ge asStack_710 [8];
  secp256k1_strauss_point_state sStack_450;
  
  uVar6 = 0x20;
  do {
    uVar4 = (int)uVar6 - 1;
    uVar6 = (ulong)uVar4;
    if (wnaf[uVar6] != 0) {
      test_fixed_wnaf_small_helper_cold_1();
      goto LAB_0016a838;
    }
  } while (8 < uVar4);
  uVar4 = 7;
  while (wnaf[uVar4] == wnaf_expected[uVar4]) {
    bVar17 = uVar4 == 0;
    uVar4 = uVar4 - 1;
    if (bVar17) {
      return;
    }
  }
LAB_0016a838:
  test_fixed_wnaf_small_helper_cold_2();
  psVar12 = (secp256k1_gej *)auStack_b00;
  psVar13 = (secp256k1_strauss_point_state *)((ulong)wnaf_expected & 0xffffffff);
  psStack_b08 = (secp256k1_strauss_point_state *)0x16a860;
  testutil_random_scalar_order_test((secp256k1_scalar *)(auStack_b00 + 0x20));
  psStack_b08 = (secp256k1_strauss_point_state *)0x16a871;
  secp256k1_scalar_add
            ((secp256k1_scalar *)auStack_b00,(secp256k1_scalar *)(auStack_b00 + 0x20),
             (secp256k1_scalar *)wnaf);
  psStack_b08 = (secp256k1_strauss_point_state *)0x16a87c;
  secp256k1_scalar_negate((secp256k1_scalar *)auStack_b00,(secp256k1_scalar *)auStack_b00);
  psVar16 = (secp256k1_scalar *)CTX;
  if ((int)wnaf_expected == 0) {
    psStack_b08 = (secp256k1_strauss_point_state *)0x16a9d4;
    secp256k1_ecmult_gen(&CTX->ecmult_gen_ctx,&sStack_928,(secp256k1_scalar *)(auStack_b00 + 0x20));
    psStack_b08 = (secp256k1_strauss_point_state *)0x16a9e7;
    secp256k1_ecmult_gen
              ((secp256k1_ecmult_gen_context *)psVar16,&sStack_9a8,(secp256k1_scalar *)auStack_b00);
    psStack_b08 = (secp256k1_strauss_point_state *)0x16a9fa;
    secp256k1_ecmult_gen
              ((secp256k1_ecmult_gen_context *)psVar16,&sStack_a28,(secp256k1_scalar *)wnaf);
  }
  else {
    psStack_b08 = (secp256k1_strauss_point_state *)0x16a894;
    testutil_random_ge_test((secp256k1_ge *)&sStack_8a8);
    sStack_ac0.infinity = (int)sStack_8a8.ecmult_gen_ctx.ge_offset.y.n[0];
    sStack_ac0.x.n[0] = sStack_8a8.ecmult_gen_ctx._0_8_;
    sStack_ac0.x.n[1] = sStack_8a8.ecmult_gen_ctx.scalar_offset.d[0];
    sStack_ac0.x.n[2] = sStack_8a8.ecmult_gen_ctx.scalar_offset.d[1];
    sStack_ac0.x.n[3] = sStack_8a8.ecmult_gen_ctx.scalar_offset.d[2];
    sStack_ac0.x.n[4] = sStack_8a8.ecmult_gen_ctx.scalar_offset.d[3];
    sStack_ac0.y.n[0] = sStack_8a8.ecmult_gen_ctx.ge_offset.x.n[0];
    sStack_ac0.y.n[1] = sStack_8a8.ecmult_gen_ctx.ge_offset.x.n[1];
    sStack_ac0.y.n[2] = sStack_8a8.ecmult_gen_ctx.ge_offset.x.n[2];
    sStack_ac0.y.n[3] = sStack_8a8.ecmult_gen_ctx.ge_offset.x.n[3];
    sStack_ac0.y.n[4] = sStack_8a8.ecmult_gen_ctx.ge_offset.x.n[4];
    sStack_ac0.z.n[0] = 1;
    sStack_ac0.z.n[1] = 0;
    sStack_ac0.z.n[2] = 0;
    sStack_ac0.z.n[3] = 0;
    sStack_ac0.z.n[4] = 0;
    if ((int)wnaf_expected == 1) {
      unaff_R12 = sStack_8a8.ecmult_gen_ctx.ge_offset.y.n + 1;
      unaff_R13 = asStack_710;
      psVar13 = &sStack_450;
      psVar16 = &secp256k1_scalar_zero;
      psStack_b08 = (secp256k1_strauss_point_state *)0x16a957;
      sStack_9a8.x.n[0] = (uint64_t)unaff_R12;
      sStack_9a8.x.n[1] = (uint64_t)unaff_R13;
      sStack_9a8.x.n[2] = (uint64_t)psVar13;
      secp256k1_ecmult_strauss_wnaf
                ((secp256k1_strauss_state *)&sStack_9a8,&sStack_928,1,&sStack_ac0,
                 (secp256k1_scalar *)(auStack_b00 + 0x20),&secp256k1_scalar_zero);
      psStack_b08 = (secp256k1_strauss_point_state *)0x16a985;
      sStack_a28.x.n[0] = (uint64_t)unaff_R12;
      sStack_a28.x.n[1] = (uint64_t)unaff_R13;
      sStack_a28.x.n[2] = (uint64_t)psVar13;
      secp256k1_ecmult_strauss_wnaf
                ((secp256k1_strauss_state *)&sStack_a28,&sStack_9a8,1,&sStack_ac0,
                 (secp256k1_scalar *)auStack_b00,&secp256k1_scalar_zero);
      psStack_b08 = (secp256k1_strauss_point_state *)0x16a9b3;
      sStack_a40.aux = (secp256k1_fe *)unaff_R12;
      sStack_a40.pre_a = unaff_R13;
      sStack_a40.ps = psVar13;
      secp256k1_ecmult_strauss_wnaf
                (&sStack_a40,&sStack_a28,1,&sStack_ac0,(secp256k1_scalar *)wnaf,
                 &secp256k1_scalar_zero);
      psVar12 = &sStack_ac0;
    }
    else {
      psVar16 = (secp256k1_scalar *)&sStack_8a8;
      psStack_b08 = (secp256k1_strauss_point_state *)0x16aa19;
      secp256k1_ecmult_const
                (&sStack_928,(secp256k1_ge *)psVar16,(secp256k1_scalar *)(auStack_b00 + 0x20));
      psStack_b08 = (secp256k1_strauss_point_state *)0x16aa2c;
      secp256k1_ecmult_const(&sStack_9a8,(secp256k1_ge *)psVar16,(secp256k1_scalar *)auStack_b00);
      psStack_b08 = (secp256k1_strauss_point_state *)0x16aa3f;
      secp256k1_ecmult_const(&sStack_a28,(secp256k1_ge *)psVar16,(secp256k1_scalar *)wnaf);
      psVar12 = (secp256k1_gej *)auStack_b00;
    }
  }
  psStack_b08 = (secp256k1_strauss_point_state *)0x16aa5c;
  secp256k1_gej_add_var(&sStack_a28,&sStack_a28,&sStack_928,(secp256k1_fe *)0x0);
  psStack_b08 = (secp256k1_strauss_point_state *)0x16aa71;
  psVar14 = &sStack_a28;
  psVar15 = &sStack_a28;
  secp256k1_gej_add_var(&sStack_a28,&sStack_a28,&sStack_9a8,(secp256k1_fe *)0x0);
  if (sStack_a28.infinity != 0) {
    return;
  }
  psStack_b08 = (secp256k1_strauss_point_state *)test_ecmult_constants_sha;
  test_ecmult_target_cold_1();
  out32 = (byte *)((ulong)psVar15 & 0xffffffff);
  pcStack_c60 = (code *)0x16aabf;
  lStack_c50 = extraout_RDX;
  psStack_b30 = &sStack_a28;
  puStack_b28 = unaff_R12;
  psStack_b20 = unaff_R13;
  psStack_b18 = (secp256k1_context *)psVar16;
  psStack_b10 = psVar12;
  psStack_b08 = psVar13;
  scratch = secp256k1_scratch_create(&CTX->error_callback,0x10000);
  iStack_c56 = (int)psVar15;
  acc = &sStack_b98;
  sStack_b98.s[0] = 0x6a09e667;
  sStack_b98.s[1] = 0xbb67ae85;
  sStack_b98.s[2] = 0x3c6ef372;
  sStack_b98.s[3] = 0xa54ff53a;
  sStack_b98.s[4] = 0x510e527f;
  sStack_b98.s[5] = 0x9b05688c;
  sStack_b98.s[6] = 0x1f83d9ab;
  sStack_b98.s[7] = 0x5be0cd19;
  psVar12 = (secp256k1_gej *)0x0;
  sStack_b98.bytes = 0;
  hash_00 = (secp256k1_sha256 *)auStack_c28;
  auStack_c28._0_4_ = 0;
  auStack_c28._4_4_ = 0;
  auStack_c28._8_4_ = 0;
  auStack_c28._12_4_ = 0;
  auStack_c28._16_4_ = 0;
  auStack_c28._20_4_ = 0;
  auStack_c28._24_4_ = 0;
  auStack_c28._28_4_ = 0;
  pcStack_c60 = (code *)0x16ab0c;
  test_ecmult_accumulate(acc,(secp256k1_scalar *)hash_00,scratch);
  auStack_c28._0_4_ = 1;
  auStack_c28._4_4_ = 0;
  auStack_c28._8_4_ = 0;
  auStack_c28._12_4_ = 0;
  auStack_c28._16_4_ = 0;
  auStack_c28._20_4_ = 0;
  auStack_c28._24_4_ = 0;
  auStack_c28._28_4_ = 0;
  pcStack_c60 = (code *)0x16ab30;
  test_ecmult_accumulate(acc,(secp256k1_scalar *)hash_00,scratch);
  pcStack_c60 = (code *)0x16ab3b;
  secp256k1_scalar_negate((secp256k1_scalar *)hash_00,(secp256k1_scalar *)hash_00);
  pcStack_c60 = (code *)0x16ab49;
  test_ecmult_accumulate(acc,(secp256k1_scalar *)hash_00,scratch);
  if (psVar14 != (secp256k1_gej *)0x0) {
    psVar12 = (secp256k1_gej *)0x0;
    hash_00 = (secp256k1_sha256 *)(auStack_c28 + 0x20);
    out32 = abStack_c48;
    acc = (secp256k1_sha256 *)auStack_c28;
    do {
      uStack_c52 = SUB82(psVar12,0);
      auStack_c28[0x20] = 'g';
      auStack_c28[0x21] = 0xe6;
      auStack_c28[0x22] = '\t';
      auStack_c28[0x23] = 'j';
      auStack_c28[0x24] = 0x85;
      auStack_c28[0x25] = 0xae;
      auStack_c28[0x26] = 'g';
      auStack_c28[0x27] = 0xbb;
      auStack_c00[0] = 'r';
      auStack_c00[1] = 0xf3;
      auStack_c00[2] = 'n';
      auStack_c00[3] = '<';
      auStack_c00[4] = ':';
      auStack_c00[5] = 0xf5;
      auStack_c00[6] = 'O';
      auStack_c00[7] = 0xa5;
      auStack_c00[8] = '\x7f';
      auStack_c00[9] = 'R';
      auStack_c00[10] = '\x0e';
      auStack_c00[0xb] = 'Q';
      auStack_c00[0xc] = 0x8c;
      auStack_c00[0xd] = 'h';
      auStack_c00[0xe] = '\x05';
      auStack_c00[0xf] = 0x9b;
      auStack_c00[0x10] = 0xab;
      auStack_c00[0x11] = 0xd9;
      auStack_c00[0x12] = 0x83;
      auStack_c00[0x13] = '\x1f';
      auStack_c00[0x14] = '\x19';
      auStack_c00[0x15] = 0xcd;
      auStack_c00[0x16] = 0xe0;
      auStack_c00[0x17] = '[';
      aiStack_ba8[0] = 0;
      aiStack_ba8[1] = 0;
      pcStack_c60 = (code *)0x16ab9a;
      secp256k1_sha256_write(hash_00,(uchar *)&iStack_c56,6);
      pcStack_c60 = (code *)0x16aba5;
      secp256k1_sha256_finalize(hash_00,out32);
      pcStack_c60 = (code *)0x16abb2;
      secp256k1_scalar_set_b32((secp256k1_scalar *)acc,out32,(int *)0x0);
      pcStack_c60 = (code *)0x16abc5;
      test_ecmult_accumulate(&sStack_b98,(secp256k1_scalar *)acc,scratch);
      psVar12 = (secp256k1_gej *)((long)(psVar12->x).n + 1);
    } while (psVar14 != psVar12);
  }
  pcStack_c60 = (code *)0x16abdf;
  secp256k1_sha256_finalize(&sStack_b98,abStack_c48);
  lVar8 = 0;
  uVar6 = extraout_RAX;
  do {
    uVar10 = uVar6 & 0xffffffff;
    bVar2 = abStack_c48[lVar8];
    psVar13 = (secp256k1_strauss_point_state *)(ulong)bVar2;
    bVar3 = *(byte *)(lStack_c50 + lVar8);
    hash = (secp256k1_sha256 *)(ulong)bVar3;
    uVar6 = (ulong)((uint)bVar2 - (uint)bVar3);
    if (bVar2 == bVar3) {
      uVar6 = uVar10;
    }
    iVar5 = (int)uVar6;
    if (bVar2 != bVar3) goto LAB_0016ac09;
    lVar8 = lVar8 + 1;
  } while (lVar8 != 0x20);
  iVar5 = 0;
LAB_0016ac09:
  if (iVar5 == 0) {
    pcStack_c60 = (code *)0x16ac21;
    secp256k1_scratch_destroy(&CTX->error_callback,scratch);
    return;
  }
  pcStack_c60 = test_ecmult_accumulate;
  test_ecmult_constants_sha_cold_1();
  auStack_1800 = (undefined1  [8])0x41;
  sStack_fd0.infinity = 0;
  sStack_fd0.x.n[0] = 0x2815b16f81798;
  sStack_fd0.x.n[1] = 0xdb2dce28d959f;
  sStack_fd0.x.n[2] = 0xe870b07029bfc;
  sStack_fd0.x.n[3] = 0xbbac55a06295c;
  sStack_fd0.x.n[4] = 0x79be667ef9dc;
  sStack_fd0.y.n[4] = 0x483ada7726a3;
  sStack_fd0.y.n[0] = 0x7d08ffb10d4b8;
  sStack_fd0.y.n[1] = 0x48a68554199c4;
  sStack_fd0.y.n[2] = 0xe1108a8fd17b4;
  sStack_fd0.y.n[3] = 0xc4655da4fbfc0;
  sStack_fd0.z.n[0] = 1;
  sStack_fd0.z.n[1] = 0;
  sStack_fd0.z.n[2] = 0;
  sStack_fd0.z.n[3] = 0;
  sStack_fd0.z.n[4] = 0;
  sStack_1050.infinity = 1;
  sStack_1050.z.n[4] = 0;
  sStack_1050.z.n[2] = 0;
  sStack_1050.z.n[3] = 0;
  sStack_1050.z.n[0] = 0;
  sStack_1050.z.n[1] = 0;
  sStack_1050.y.n[3] = 0;
  sStack_1050.y.n[4] = 0;
  sStack_1050.y.n[1] = 0;
  sStack_1050.y.n[2] = 0;
  sStack_1050.x.n[4] = 0;
  sStack_1050.y.n[0] = 0;
  sStack_1050.x.n[2] = 0;
  sStack_1050.x.n[3] = 0;
  sStack_1050.x.n[0] = 0;
  sStack_1050.x.n[1] = 0;
  psStack_1828 = (secp256k1_strauss_point_state *)0x16ad29;
  auStack_f50._712_8_ = psVar12;
  psStack_c80 = hash_00;
  psStack_c78 = scratch;
  psStack_c70 = acc;
  psStack_c68 = psVar14;
  pcStack_c60 = (code *)out32;
  secp256k1_ecmult_gen(&CTX->ecmult_gen_ctx,&sStack_1620,(secp256k1_scalar *)psVar13);
  r_00 = (secp256k1_strauss_point_state *)auStack_f50;
  psStack_1828 = (secp256k1_strauss_point_state *)0x16ad76;
  sStack_1720.x.n[0] = (uint64_t)asStack_15a0;
  sStack_1720.x.n[1] = (uint64_t)r_00;
  sStack_1720.x.n[2] = (uint64_t)&sStack_1460;
  secp256k1_ecmult_strauss_wnaf
            ((secp256k1_strauss_state *)&sStack_1720,&sStack_16a0,1,&sStack_fd0,
             (secp256k1_scalar *)psVar13,&secp256k1_scalar_zero);
  psStack_1828 = (secp256k1_strauss_point_state *)0x16ada9;
  sStack_17a0.x.n[0] = (uint64_t)asStack_15a0;
  sStack_17a0.x.n[1] = (uint64_t)r_00;
  sStack_17a0.x.n[2] = (uint64_t)&sStack_1460;
  secp256k1_ecmult_strauss_wnaf
            ((secp256k1_strauss_state *)&sStack_17a0,&sStack_1720,1,&sStack_1050,
             &secp256k1_scalar_zero,(secp256k1_scalar *)psVar13);
  error_callback = (secp256k1_callback *)0xb8;
  elem = (secp256k1_strauss_point_state *)&CTX->error_callback;
  cb = (secp256k1_ecmult_multi_callback *)0x0;
  cbdata = (secp256k1_strauss_point_state *)0x0;
  psStack_1828 = (secp256k1_strauss_point_state *)0x16add8;
  psVar16 = (secp256k1_scalar *)psVar13;
  scratch_01 = scratch_00;
  iVar5 = secp256k1_ecmult_multi_var
                    ((secp256k1_callback *)elem,(secp256k1_scratch *)scratch_00,
                     (secp256k1_gej *)auStack_f50,(secp256k1_scalar *)psVar13,
                     (secp256k1_ecmult_multi_callback *)0x0,(void *)0x0,0);
  if (iVar5 == 0) {
    psStack_1828 = (secp256k1_strauss_point_state *)0x16afb5;
    test_ecmult_accumulate_cold_8();
LAB_0016afb5:
    psStack_1828 = (secp256k1_strauss_point_state *)0x16afba;
    test_ecmult_accumulate_cold_7();
LAB_0016afba:
    psStack_1828 = (secp256k1_strauss_point_state *)0x16afbf;
    test_ecmult_accumulate_cold_6();
LAB_0016afbf:
    psStack_1828 = (secp256k1_strauss_point_state *)0x16afc4;
    test_ecmult_accumulate_cold_5();
LAB_0016afc4:
    psStack_1828 = (secp256k1_strauss_point_state *)0x16afc9;
    test_ecmult_accumulate_cold_4();
LAB_0016afc9:
    psStack_1828 = (secp256k1_strauss_point_state *)0x16afce;
    test_ecmult_accumulate_cold_3();
LAB_0016afce:
    psStack_1828 = (secp256k1_strauss_point_state *)0x16afd3;
    test_ecmult_accumulate_cold_2();
  }
  else {
    error_callback = &CTX->error_callback;
    psVar16 = &secp256k1_scalar_zero;
    cb = test_ecmult_accumulate_cb;
    psStack_1828 = (secp256k1_strauss_point_state *)0x16ae13;
    scratch_01 = scratch_00;
    elem = (secp256k1_strauss_point_state *)error_callback;
    cbdata = psVar13;
    iVar5 = secp256k1_ecmult_multi_var
                      (error_callback,(secp256k1_scratch *)scratch_00,asStack_15a0,
                       &secp256k1_scalar_zero,test_ecmult_accumulate_cb,psVar13,1);
    if (iVar5 == 0) goto LAB_0016afb5;
    psStack_1828 = (secp256k1_strauss_point_state *)0x16ae32;
    secp256k1_ecmult_const(&sStack_17a0,&secp256k1_ge_const_g,(secp256k1_scalar *)psVar13);
    psVar13 = (secp256k1_strauss_point_state *)auStack_17f8;
    psStack_1828 = (secp256k1_strauss_point_state *)0x16ae47;
    secp256k1_ge_set_gej_var((secp256k1_ge *)psVar13,&sStack_1620);
    r_00 = &sStack_1460;
    psStack_1828 = (secp256k1_strauss_point_state *)0x16ae5f;
    secp256k1_gej_neg((secp256k1_gej *)r_00,&sStack_16a0);
    psVar16 = (secp256k1_scalar *)0x0;
    psStack_1828 = (secp256k1_strauss_point_state *)0x16ae6f;
    scratch_01 = r_00;
    elem = r_00;
    secp256k1_gej_add_ge_var
              ((secp256k1_gej *)r_00,(secp256k1_gej *)r_00,(secp256k1_ge *)psVar13,
               (secp256k1_fe *)0x0);
    if (sStack_1460.wnaf_na_1[0x1e] == 0) goto LAB_0016afba;
    psVar13 = &sStack_1460;
    psStack_1828 = (secp256k1_strauss_point_state *)0x16ae92;
    secp256k1_gej_neg((secp256k1_gej *)psVar13,&sStack_1720);
    psVar16 = (secp256k1_scalar *)0x0;
    psStack_1828 = (secp256k1_strauss_point_state *)0x16aea4;
    scratch_01 = psVar13;
    elem = psVar13;
    secp256k1_gej_add_ge_var
              ((secp256k1_gej *)psVar13,(secp256k1_gej *)psVar13,(secp256k1_ge *)auStack_17f8,
               (secp256k1_fe *)0x0);
    if (sStack_1460.wnaf_na_1[0x1e] == 0) goto LAB_0016afbf;
    psVar13 = &sStack_1460;
    psStack_1828 = (secp256k1_strauss_point_state *)0x16aec7;
    secp256k1_gej_neg((secp256k1_gej *)psVar13,(secp256k1_gej *)auStack_f50);
    psVar16 = (secp256k1_scalar *)0x0;
    psStack_1828 = (secp256k1_strauss_point_state *)0x16aed9;
    scratch_01 = psVar13;
    elem = psVar13;
    secp256k1_gej_add_ge_var
              ((secp256k1_gej *)psVar13,(secp256k1_gej *)psVar13,(secp256k1_ge *)auStack_17f8,
               (secp256k1_fe *)0x0);
    if (sStack_1460.wnaf_na_1[0x1e] == 0) goto LAB_0016afc4;
    psVar13 = &sStack_1460;
    psStack_1828 = (secp256k1_strauss_point_state *)0x16aefc;
    secp256k1_gej_neg((secp256k1_gej *)psVar13,asStack_15a0);
    psVar16 = (secp256k1_scalar *)0x0;
    psStack_1828 = (secp256k1_strauss_point_state *)0x16af0e;
    scratch_01 = psVar13;
    elem = psVar13;
    secp256k1_gej_add_ge_var
              ((secp256k1_gej *)psVar13,(secp256k1_gej *)psVar13,(secp256k1_ge *)auStack_17f8,
               (secp256k1_fe *)0x0);
    if (sStack_1460.wnaf_na_1[0x1e] == 0) goto LAB_0016afc9;
    psVar13 = &sStack_1460;
    psStack_1828 = (secp256k1_strauss_point_state *)0x16af31;
    secp256k1_gej_neg((secp256k1_gej *)psVar13,&sStack_17a0);
    psVar16 = (secp256k1_scalar *)0x0;
    psStack_1828 = (secp256k1_strauss_point_state *)0x16af43;
    scratch_01 = psVar13;
    elem = psVar13;
    secp256k1_gej_add_ge_var
              ((secp256k1_gej *)psVar13,(secp256k1_gej *)psVar13,(secp256k1_ge *)auStack_17f8,
               (secp256k1_fe *)0x0);
    if (sStack_1460.wnaf_na_1[0x1e] == 0) goto LAB_0016afce;
    if (auStack_17f8._80_4_ != 0) {
      sStack_1460.wnaf_na_1[0]._0_1_ = 0;
      sVar11 = 1;
LAB_0016af94:
      psStack_1828 = (secp256k1_strauss_point_state *)0x16af9e;
      secp256k1_sha256_write(hash,(uchar *)&sStack_1460,sVar11);
      return;
    }
    elem = (secp256k1_strauss_point_state *)auStack_17f8;
    scratch_01 = &sStack_1460;
    psVar13 = (secp256k1_strauss_point_state *)auStack_1800;
    psVar16 = (secp256k1_scalar *)0x0;
    psStack_1828 = (secp256k1_strauss_point_state *)0x16af83;
    secp256k1_eckey_pubkey_serialize((secp256k1_ge *)elem,(uchar *)scratch_01,(size_t *)psVar13,0);
    if (auStack_1800 == (undefined1  [8])0x41) {
      sVar11 = 0x41;
      goto LAB_0016af94;
    }
  }
  psStack_1828 = (secp256k1_strauss_point_state *)secp256k1_ecmult_multi_var;
  test_ecmult_accumulate_cold_1();
  r->infinity = 1;
  (r->x).n[0] = 0;
  (r->x).n[1] = 0;
  (r->x).n[2] = 0;
  (r->x).n[3] = 0;
  (r->x).n[4] = 0;
  (r->y).n[0] = 0;
  (r->y).n[1] = 0;
  (r->y).n[2] = 0;
  (r->y).n[3] = 0;
  (r->y).n[4] = 0;
  (r->z).n[0] = 0;
  (r->z).n[1] = 0;
  (r->z).n[2] = 0;
  (r->z).n[3] = 0;
  (r->z).n[4] = 0;
  if ((secp256k1_strauss_point_state *)psVar16 != (secp256k1_strauss_point_state *)0x0 ||
      psStack_1818 != (secp256k1_strauss_point_state *)0x0) {
    psStack_1848 = error_callback;
    psStack_1840 = &sStack_1050;
    psStack_1838 = psVar13;
    psStack_1830 = r_00;
    psStack_1828 = &sStack_1460;
    if (psStack_1818 != (secp256k1_strauss_point_state *)0x0) {
      if (scratch_01 != (secp256k1_strauss_point_state *)0x0) {
        sVar11 = secp256k1_pippenger_max_points
                           ((secp256k1_callback *)elem,(secp256k1_scratch *)scratch_01);
        if (sVar11 != 0) {
          uVar6 = 5000000;
          if (sVar11 < 5000000) {
            uVar6 = sVar11;
          }
          puVar1 = (undefined1 *)((long)psStack_1818[-1].wnaf_na_lam + 0x20b);
          uStack_2098 = (ulong)puVar1 / uVar6 + 1;
          r_00 = (secp256k1_strauss_point_state *)((ulong)puVar1 / uStack_2098 + 1);
        }
        if (sVar11 != 0) {
          if (r_00 < (secp256k1_strauss_point_state *)0x58) {
            sVar11 = secp256k1_scratch_max_allocation
                               ((secp256k1_callback *)elem,(secp256k1_scratch *)scratch_01,5);
            if (0x8af < sVar11) {
              uVar6 = sVar11 / 0x8b0;
              if (4999999 < uVar6) {
                uVar6 = 5000000;
              }
              puVar1 = (undefined1 *)((long)psStack_1818[-1].wnaf_na_lam + 0x20b);
              uStack_2098 = (ulong)puVar1 / uVar6 + 1;
              r_00 = (secp256k1_strauss_point_state *)((ulong)puVar1 / uStack_2098 + 1);
            }
            if (sVar11 < 0x8b0) goto LAB_0016b190;
            pcVar7 = secp256k1_ecmult_strauss_batch;
          }
          else {
            pcVar7 = secp256k1_ecmult_pippenger_batch;
          }
          lVar8 = 0;
          uVar6 = 0;
          while( true ) {
            psVar13 = r_00;
            if (psStack_1818 < r_00) {
              psVar13 = psStack_1818;
            }
            psVar9 = (secp256k1_strauss_point_state *)0x0;
            if (uVar6 == 0) {
              psVar9 = (secp256k1_strauss_point_state *)psVar16;
            }
            iVar5 = (*pcVar7)(elem,scratch_01,&sStack_1f28,psVar9,cb,cbdata,psVar13,lVar8);
            if (iVar5 == 0) break;
            secp256k1_gej_add_var(r,r,(secp256k1_gej *)&sStack_1f28,(secp256k1_fe *)0x0);
            psStack_1818 = (secp256k1_strauss_point_state *)((long)psStack_1818 - (long)psVar13);
            uVar6 = uVar6 + 1;
            lVar8 = (long)((secp256k1_fe *)r_00->wnaf_na_1)->n + lVar8;
            if (uStack_2098 == uVar6) {
              return;
            }
          }
          return;
        }
      }
LAB_0016b190:
      secp256k1_ecmult_multi_simple_var(r,psVar16,cb,cbdata,(size_t)psStack_1818);
      return;
    }
    sStack_2080.aux = asStack_2068;
    sStack_2080.pre_a = asStack_1b18;
    sStack_2080.ps = &sStack_1f28;
    secp256k1_ecmult_strauss_wnaf(&sStack_2080,r,1,r,&secp256k1_scalar_zero,psVar16);
  }
  return;
}

Assistant:

static void test_fixed_wnaf_small_helper(int *wnaf, int *wnaf_expected, int w) {
    int i;
    for (i = WNAF_SIZE(w)-1; i >= 8; --i) {
        CHECK(wnaf[i] == 0);
    }
    for (i = 7; i >= 0; --i) {
        CHECK(wnaf[i] == wnaf_expected[i]);
    }
}